

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::PrintToFloatingPoint<double>(floating_point<double> *f,iu_ostream *os)

{
  undefined8 uVar1;
  ostream *poVar2;
  UInt value;
  iu_ostream *local_218;
  string local_200;
  string local_1e0 [32];
  double local_1c0 [3];
  int local_1a4;
  stringstream local_1a0 [8];
  iu_stringstream ss;
  iu_ostream *os_local;
  floating_point<double> *f_local;
  
  ss._384_8_ = os;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = (int)std::setprecision(0x11);
  std::operator<<((ostream *)&ss.field_0x8,(_Setprecision)local_1a4);
  local_1c0[0] = floating_point<double>::raw(f);
  local_218 = (iu_ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a0) {
    local_218 = (iu_ostream *)&ss.field_0x8;
  }
  UniversalPrint<double>(local_1c0,local_218);
  uVar1 = ss._384_8_;
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)uVar1,local_1e0);
  poVar2 = std::operator<<(poVar2,"(0x");
  value = floating_point<double>::bits(f);
  ToHexString<unsigned_long>(&local_200,value);
  poVar2 = std::operator<<(poVar2,(string *)&local_200);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}